

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool absl::lts_20250127::time_internal::cctz::anon_unknown_0::AllYearDST(PosixTimeZone *posix)

{
  int_fast32_t offset;
  PosixTimeZone *posix_local;
  
  if ((posix->dst_start).date.fmt == N) {
    if ((posix->dst_start).date.field_1 == (anon_union_8_3_4e90bb4b_for_Date_1)0x0) {
      if ((posix->dst_start).time.offset == 0) {
        if ((posix->dst_end).date.fmt == J) {
          if ((posix->dst_end).date.field_1 == (anon_union_8_3_4e90bb4b_for_Date_1)0x16d) {
            if ((posix->dst_end).time.offset + (posix->std_offset - posix->dst_offset) == 0x15180) {
              posix_local._7_1_ = true;
            }
            else {
              posix_local._7_1_ = false;
            }
          }
          else {
            posix_local._7_1_ = false;
          }
        }
        else {
          posix_local._7_1_ = false;
        }
      }
      else {
        posix_local._7_1_ = false;
      }
    }
    else {
      posix_local._7_1_ = false;
    }
  }
  else {
    posix_local._7_1_ = false;
  }
  return posix_local._7_1_;
}

Assistant:

bool AllYearDST(const PosixTimeZone& posix) {
  if (posix.dst_start.date.fmt != PosixTransition::N) return false;
  if (posix.dst_start.date.n.day != 0) return false;
  if (posix.dst_start.time.offset != 0) return false;

  if (posix.dst_end.date.fmt != PosixTransition::J) return false;
  if (posix.dst_end.date.j.day != kDaysPerYear[0]) return false;
  const auto offset = posix.std_offset - posix.dst_offset;
  if (posix.dst_end.time.offset + offset != kSecsPerDay) return false;

  return true;
}